

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wyhash.h
# Opt level: O1

uint64_t wyhash(void *key,uint64_t len,uint64_t seed)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  ulong uVar49;
  ulong uVar50;
  uint64_t see1;
  ulong uVar51;
  uint64_t i;
  ulong uVar52;
  
  if (len == 0) {
    return 0;
  }
  uVar49 = seed;
  uVar51 = len;
  if (0x20 < len) {
    if (0x100 < len) {
      do {
        auVar7._8_8_ = 0;
        auVar7._0_8_ = *(ulong *)((long)key + 8) ^ uVar49 ^ 0xe7037ed1a0b428db;
        auVar31._8_8_ = 0;
        auVar31._0_8_ = *key ^ uVar49 ^ 0xa0761d6478bd642f;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = uVar49 ^ *(ulong *)((long)key + 0x18) ^ 0x589965cc75374cc3;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = *(ulong *)((long)key + 0x10) ^ uVar49 ^ 0x8ebc6af09c88c6e3;
        auVar7 = auVar7 * auVar31 ^ auVar8 * auVar32;
        uVar52 = auVar7._8_8_ ^ auVar7._0_8_;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = *(ulong *)((long)key + 0x28) ^ seed ^ 0x8ebc6af09c88c6e3;
        auVar33._8_8_ = 0;
        auVar33._0_8_ = *(ulong *)((long)key + 0x20) ^ seed ^ 0xe7037ed1a0b428db;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = seed ^ *(ulong *)((long)key + 0x38) ^ 0xa0761d6478bd642f;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = *(ulong *)((long)key + 0x30) ^ seed ^ 0x589965cc75374cc3;
        auVar7 = auVar9 * auVar33 ^ auVar10 * auVar34;
        uVar49 = auVar7._8_8_ ^ auVar7._0_8_;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = *(ulong *)((long)key + 0x48) ^ uVar52 ^ 0xe7037ed1a0b428db;
        auVar35._8_8_ = 0;
        auVar35._0_8_ = *(ulong *)((long)key + 0x40) ^ uVar52 ^ 0xa0761d6478bd642f;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = uVar52 ^ *(ulong *)((long)key + 0x58) ^ 0x589965cc75374cc3;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = *(ulong *)((long)key + 0x50) ^ uVar52 ^ 0x8ebc6af09c88c6e3;
        auVar7 = auVar11 * auVar35 ^ auVar12 * auVar36;
        uVar52 = auVar7._8_8_ ^ auVar7._0_8_;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = *(ulong *)((long)key + 0x68) ^ uVar49 ^ 0x8ebc6af09c88c6e3;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = *(ulong *)((long)key + 0x60) ^ uVar49 ^ 0xe7037ed1a0b428db;
        auVar14._8_8_ = 0;
        auVar14._0_8_ = uVar49 ^ *(ulong *)((long)key + 0x78) ^ 0xa0761d6478bd642f;
        auVar38._8_8_ = 0;
        auVar38._0_8_ = *(ulong *)((long)key + 0x70) ^ uVar49 ^ 0x589965cc75374cc3;
        auVar7 = auVar13 * auVar37 ^ auVar14 * auVar38;
        uVar49 = auVar7._8_8_ ^ auVar7._0_8_;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = *(ulong *)((long)key + 0x88) ^ uVar52 ^ 0xe7037ed1a0b428db;
        auVar39._8_8_ = 0;
        auVar39._0_8_ = *(ulong *)((long)key + 0x80) ^ uVar52 ^ 0xa0761d6478bd642f;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = uVar52 ^ *(ulong *)((long)key + 0x98) ^ 0x589965cc75374cc3;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = *(ulong *)((long)key + 0x90) ^ uVar52 ^ 0x8ebc6af09c88c6e3;
        auVar7 = auVar15 * auVar39 ^ auVar16 * auVar40;
        uVar50 = auVar7._8_8_ ^ auVar7._0_8_;
        auVar17._8_8_ = 0;
        auVar17._0_8_ = *(ulong *)((long)key + 0xa8) ^ uVar49 ^ 0x8ebc6af09c88c6e3;
        auVar41._8_8_ = 0;
        auVar41._0_8_ = *(ulong *)((long)key + 0xa0) ^ uVar49 ^ 0xe7037ed1a0b428db;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = uVar49 ^ *(ulong *)((long)key + 0xb8) ^ 0xa0761d6478bd642f;
        auVar42._8_8_ = 0;
        auVar42._0_8_ = *(ulong *)((long)key + 0xb0) ^ uVar49 ^ 0x589965cc75374cc3;
        auVar7 = auVar17 * auVar41 ^ auVar18 * auVar42;
        uVar52 = auVar7._8_8_ ^ auVar7._0_8_;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = *(ulong *)((long)key + 200) ^ uVar50 ^ 0xe7037ed1a0b428db;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = *(ulong *)((long)key + 0xc0) ^ uVar50 ^ 0xa0761d6478bd642f;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = uVar50 ^ *(ulong *)((long)key + 0xd8) ^ 0x589965cc75374cc3;
        auVar44._8_8_ = 0;
        auVar44._0_8_ = *(ulong *)((long)key + 0xd0) ^ uVar50 ^ 0x8ebc6af09c88c6e3;
        auVar7 = auVar19 * auVar43 ^ auVar20 * auVar44;
        uVar49 = auVar7._8_8_ ^ auVar7._0_8_;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = *(ulong *)((long)key + 0xe8) ^ uVar52 ^ 0x8ebc6af09c88c6e3;
        auVar45._8_8_ = 0;
        auVar45._0_8_ = *(ulong *)((long)key + 0xe0) ^ uVar52 ^ 0xe7037ed1a0b428db;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = uVar52 ^ *(ulong *)((long)key + 0xf8) ^ 0xa0761d6478bd642f;
        auVar46._8_8_ = 0;
        auVar46._0_8_ = *(ulong *)((long)key + 0xf0) ^ uVar52 ^ 0x589965cc75374cc3;
        auVar7 = auVar21 * auVar45 ^ auVar22 * auVar46;
        seed = auVar7._8_8_ ^ auVar7._0_8_;
        uVar51 = uVar51 - 0x100;
        key = (void *)((long)key + 0x100);
      } while (0x100 < uVar51);
    }
    for (; 0x20 < uVar51; uVar51 = uVar51 - 0x20) {
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar49 ^ *(ulong *)((long)key + 8) ^ 0xe7037ed1a0b428db;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = *key ^ uVar49 ^ 0xa0761d6478bd642f;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = seed ^ *(ulong *)((long)key + 0x18) ^ 0x589965cc75374cc3;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = *(ulong *)((long)key + 0x10) ^ seed ^ 0x8ebc6af09c88c6e3;
      seed = SUB168(auVar24 * auVar48,8) ^ SUB168(auVar24 * auVar48,0);
      key = (void *)((long)key + 0x20);
      uVar49 = SUB168(auVar23 * auVar47,8) ^ SUB168(auVar23 * auVar47,0);
    }
  }
  if (uVar51 < 4) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = ((ulong)*(byte *)((long)key + (ulong)((int)uVar51 - 1)) |
                   (ulong)((uint)*(byte *)((long)key + (uVar51 >> 1)) << 8 |
                          (uint)(byte)*key << 0x10)) ^ 0xa0761d6478bd642f ^ uVar49;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar49 ^ 0xe7037ed1a0b428db;
    auVar1 = auVar1 * auVar25;
  }
  else {
    if (uVar51 < 9) {
      uVar52 = (ulong)(uint)*key;
      uVar51 = (ulong)*(uint *)((long)key + (uVar51 - 4));
    }
    else {
      if (0x10 < uVar51) {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = CONCAT44((uint)*(ulong *)((long)key + 8),*(uint *)((long)key + 0xc)) ^
                       0xe7037ed1a0b428db ^ uVar49;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = CONCAT44((uint)*key,*(uint *)((long)key + 4)) ^ 0xa0761d6478bd642f ^ uVar49;
        uVar49 = SUB168(auVar4 * auVar28,8) ^ SUB168(auVar4 * auVar28,0);
        if (uVar51 < 0x19) {
          auVar5._8_8_ = 0;
          auVar5._0_8_ = CONCAT44(*(undefined4 *)((long)key + (uVar51 - 8)),
                                  *(undefined4 *)((long)key + (uVar51 - 4))) ^ 0x8ebc6af09c88c6e3 ^
                         seed;
          auVar29._8_8_ = 0;
          auVar29._0_8_ = seed ^ 0x589965cc75374cc3;
          auVar5 = auVar5 * auVar29;
        }
        else {
          auVar6._8_8_ = 0;
          auVar6._0_8_ = CONCAT44(*(undefined4 *)((long)key + (uVar51 - 8)),
                                  *(undefined4 *)((long)key + (uVar51 - 4))) ^ 0x589965cc75374cc3 ^
                         seed;
          auVar30._8_8_ = 0;
          auVar30._0_8_ =
               CONCAT44((uint)*(ulong *)((long)key + 0x10),*(uint *)((long)key + 0x14)) ^
               0x8ebc6af09c88c6e3 ^ seed;
          auVar5 = auVar6 * auVar30;
        }
        seed = auVar5._8_8_ ^ auVar5._0_8_;
        goto LAB_00106484;
      }
      uVar52 = CONCAT44((uint)*key,*(uint *)((long)key + 4));
      uVar51 = CONCAT44(*(undefined4 *)((long)key + (uVar51 - 8)),
                        *(undefined4 *)((long)key + (uVar51 - 4)));
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar51 ^ 0xe7037ed1a0b428db ^ uVar49;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar52 ^ 0xa0761d6478bd642f ^ uVar49;
    auVar1 = auVar2 * auVar26;
  }
  uVar49 = auVar1._8_8_ ^ auVar1._0_8_;
LAB_00106484:
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar49 ^ seed;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = len ^ 0x1d8e4e27c47d124f;
  return SUB168(auVar3 * auVar27,8) ^ SUB168(auVar3 * auVar27,0);
}

Assistant:

static	inline	uint64_t	__wyr8(const	uint8_t	*p)	{	return	(_wyr4(p)<<32)|_wyr4(p+4);	}